

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distributivity.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::DistributivityRule::Apply
          (DistributivityRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  pointer puVar1;
  reference pvVar2;
  BoundConjunctionExpression *idx;
  DistributivityRule *pDVar3;
  type pEVar4;
  iterator iVar5;
  pointer pBVar6;
  ulong uVar7;
  reference pvVar8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer __args;
  idx_t i;
  Expression *expr;
  BoundConjunctionExpression *conj;
  ulong uVar9;
  __node_base *p_Var10;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  undefined1 local_e0 [8];
  expression_set_t next_set;
  expression_set_t intersect_result;
  expression_set_t candidate_set;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  idx = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                  (&pvVar2->_M_data->super_BaseExpression);
  candidate_set._M_h._M_buckets = &candidate_set._M_h._M_single_bucket;
  candidate_set._M_h._M_bucket_count = 1;
  candidate_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  candidate_set._M_h._M_element_count = 0;
  candidate_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  candidate_set._M_h._M_rehash_policy._M_next_resize = 0;
  candidate_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &idx->children;
  pDVar3 = (DistributivityRule *)
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)pDVar3);
  AddExpressionSet(pDVar3,pEVar4,&candidate_set);
  for (uVar9 = 1; p_Var10 = &candidate_set._M_h._M_before_begin,
      uVar9 < (ulong)((long)(idx->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(idx->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    next_set._M_h._M_buckets = &next_set._M_h._M_single_bucket;
    next_set._M_h._M_bucket_count = 1;
    next_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    next_set._M_h._M_element_count = 0;
    next_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    next_set._M_h._M_rehash_policy._M_next_resize = 0;
    next_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pDVar3 = (DistributivityRule *)
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_00,uVar9);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)pDVar3);
    AddExpressionSet(pDVar3,pEVar4,(expression_set_t *)&next_set._M_h);
    intersect_result._M_h._M_buckets = &intersect_result._M_h._M_single_bucket;
    intersect_result._M_h._M_bucket_count = 1;
    intersect_result._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    intersect_result._M_h._M_element_count = 0;
    intersect_result._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    intersect_result._M_h._M_rehash_policy._M_next_resize = 0;
    intersect_result._M_h._M_single_bucket = (__node_base_ptr)0x0;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      iVar5 = ::std::
              _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&next_set._M_h,(key_type *)(p_Var10 + 1));
      if (iVar5.super__Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true>._M_cur
          != (__node_type *)0x0) {
        ::std::__detail::
        _Insert_base<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&intersect_result._M_h,(value_type *)(p_Var10 + 1));
      }
    }
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=(&candidate_set._M_h,&intersect_result._M_h);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&intersect_result._M_h);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&next_set._M_h);
  }
  if (candidate_set._M_h._M_element_count != 0) {
    conj = (BoundConjunctionExpression *)&intersect_result;
    intersect_result._M_h._M_buckets =
         (__buckets_ptr)CONCAT71(intersect_result._M_h._M_buckets._1_7_,0x32);
    make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType>
              ((duckdb *)&next_set,(ExpressionType *)conj);
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      ExtractExpression((DistributivityRule *)&intersect_result,conj,(idx_t)idx,(Expression *)0x0);
      for (expr = (Expression *)0x1;
          expr < (Expression *)
                 ((long)(idx->children).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(idx->children).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          expr = (Expression *)((long)&(expr->super_BaseExpression)._vptr_BaseExpression + 1)) {
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &intersect_result);
        ExtractExpression((DistributivityRule *)local_e0,conj,(idx_t)idx,expr);
        if (local_e0 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_e0 + 8))();
        }
        local_e0 = (undefined1  [8])0x0;
      }
      pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                             *)&next_set);
      conj = (BoundConjunctionExpression *)&intersect_result;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar6->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &intersect_result);
      if (intersect_result._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*intersect_result._M_h._M_buckets)[1]._M_nxt)();
      }
    }
    uVar9 = 0;
LAB_015b0b06:
    uVar7 = (long)(idx->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(idx->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)((long)uVar7 >> 3)) goto LAB_015b0b1a;
    if (uVar7 == 8) {
      pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                             *)&next_set);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar6->children,pvVar8);
    }
    else if (8 < uVar7) {
      local_e8._M_head_impl._0_1_ = 0x33;
      make_uniq<duckdb::BoundConjunctionExpression,duckdb::ExpressionType>
                ((duckdb *)&intersect_result,(ExpressionType *)&local_e8);
      puVar1 = (idx->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = (idx->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != puVar1; __args = __args + 1
          ) {
        pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                 ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                               *)&intersect_result);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar6->children,__args);
      }
      pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                             *)&next_set);
      local_e8._M_head_impl = (Expression *)intersect_result._M_h._M_buckets;
      intersect_result._M_h._M_buckets = (__buckets_ptr)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar6->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_e8);
      if (local_e8._M_head_impl != (Expression *)0x0) {
        (*(code *)((__node_base_ptr)
                  ((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)[1]._M_nxt)()
        ;
      }
      if (intersect_result._M_h._M_buckets != (__buckets_ptr)0x0) {
        (*(code *)(*intersect_result._M_h._M_buckets)[1]._M_nxt)();
      }
    }
    pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                           *)&next_set);
    if ((long)(pBVar6->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pBVar6->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_015b0ca0;
    pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                           *)&next_set);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(&pBVar6->children,0);
    goto LAB_015b0c7b;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_015b0ca3:
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&candidate_set._M_h);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
LAB_015b0b1a:
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,uVar9);
  uVar9 = uVar9 + 1;
  if ((pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
  goto LAB_015b0b30;
  goto LAB_015b0b06;
LAB_015b0b30:
  pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                         *)&next_set);
  if ((ulong)((long)(pBVar6->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar6->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    pBVar6 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                           *)&next_set);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(&pBVar6->children,0);
LAB_015b0c7b:
    (this->super_Rule)._vptr_Rule =
         (_func_int **)
         (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (next_set._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*next_set._M_h._M_buckets)[1]._M_nxt)();
    }
  }
  else {
LAB_015b0ca0:
    (this->super_Rule)._vptr_Rule = (_func_int **)next_set._M_h._M_buckets;
  }
  goto LAB_015b0ca3;
}

Assistant:

unique_ptr<Expression> DistributivityRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                 bool &changes_made, bool is_root) {
	auto &initial_or = bindings[0].get().Cast<BoundConjunctionExpression>();

	// we want to find expressions that occur in each of the children of the OR
	// i.e. (X AND A) OR (X AND B) => X occurs in all branches
	// first, for the initial child, we create an expression set of which expressions occur
	// this is our initial candidate set (in the example: [X, A])
	expression_set_t candidate_set;
	AddExpressionSet(*initial_or.children[0], candidate_set);
	// now for each of the remaining children, we create a set again and intersect them
	// in our example: the second set would be [X, B]
	// the intersection would leave [X]
	for (idx_t i = 1; i < initial_or.children.size(); i++) {
		expression_set_t next_set;
		AddExpressionSet(*initial_or.children[i], next_set);
		expression_set_t intersect_result;
		for (auto &expr : candidate_set) {
			if (next_set.find(expr) != next_set.end()) {
				intersect_result.insert(expr);
			}
		}
		candidate_set = intersect_result;
	}
	if (candidate_set.empty()) {
		// nothing found: abort
		return nullptr;
	}
	// now for each of the remaining expressions in the candidate set we know that it is contained in all branches of
	// the OR
	auto new_root = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND);
	for (auto &expr : candidate_set) {
		D_ASSERT(initial_or.children.size() > 0);

		// extract the expression from the first child of the OR
		auto result = ExtractExpression(initial_or, 0, expr.get());
		// now for the subsequent expressions, simply remove the expression
		for (idx_t i = 1; i < initial_or.children.size(); i++) {
			ExtractExpression(initial_or, i, *result);
		}
		// now we add the expression to the new root
		new_root->children.push_back(std::move(result));
	}

	// check if we completely erased one of the children of the OR
	// this happens if we have an OR in the form of "X OR (X AND A)"
	// the left child will be completely empty, as it only contains common expressions
	// in this case, any other children are not useful:
	// X OR (X AND A) is the same as "X"
	// since (1) only tuples that do not qualify "X" will not pass this predicate
	//   and (2) all tuples that qualify "X" will pass this predicate
	for (idx_t i = 0; i < initial_or.children.size(); i++) {
		if (!initial_or.children[i]) {
			if (new_root->children.size() <= 1) {
				return std::move(new_root->children[0]);
			} else {
				return std::move(new_root);
			}
		}
	}
	// finally we need to add the remaining expressions in the OR to the new root
	if (initial_or.children.size() == 1) {
		// one child: skip the OR entirely and only add the single child
		new_root->children.push_back(std::move(initial_or.children[0]));
	} else if (initial_or.children.size() > 1) {
		// multiple children still remain: push them into a new OR and add that to the new root
		auto new_or = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_OR);
		for (auto &child : initial_or.children) {
			new_or->children.push_back(std::move(child));
		}
		new_root->children.push_back(std::move(new_or));
	}
	// finally return the new root
	if (new_root->children.size() == 1) {
		return std::move(new_root->children[0]);
	}
	return std::move(new_root);
}